

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintCharsAsStringTo<wchar_t>(wchar_t *begin,size_t len,ostream *os)

{
  wchar_t ch;
  bool bVar1;
  CharFormat CVar2;
  ostream *poVar3;
  ulong uStack_38;
  wchar_t cur;
  size_t index;
  CharFormat print_format;
  bool is_previous_hex;
  char *kQuoteBegin;
  ostream *os_local;
  size_t len_local;
  wchar_t *begin_local;
  
  std::operator<<(os,"L\"");
  bVar1 = false;
  index._0_4_ = kAsIs;
  for (uStack_38 = 0; uStack_38 < len; uStack_38 = uStack_38 + 1) {
    ch = begin[uStack_38];
    if ((bVar1) && (bVar1 = IsXDigit(ch), bVar1)) {
      poVar3 = std::operator<<(os,"\" ");
      std::operator<<(poVar3,"L\"");
    }
    CVar2 = PrintAsStringLiteralTo(ch,os);
    bVar1 = CVar2 == kHexEscape;
    if (bVar1) {
      index._0_4_ = kHexEscape;
    }
  }
  std::operator<<(os,"\"");
  return (CharFormat)index;
}

Assistant:

static CharFormat PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const kQuoteBegin = sizeof(CharType) == 1 ? "\"" : "L\"";
  *os << kQuoteBegin;
  bool is_previous_hex = false;
  CharFormat print_format = kAsIs;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << kQuoteBegin;
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
    // Remember if any characters required hex escaping.
    if (is_previous_hex) {
      print_format = kHexEscape;
    }
  }
  *os << "\"";
  return print_format;
}